

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O0

void av1_configure_buffer_updates
               (AV1_COMP *cpi,RefreshFrameInfo *refresh_frame,FRAME_UPDATE_TYPE type,
               REFBUF_STATE refbuf_state,int force_refresh_all)

{
  AV1_PRIMARY *pAVar1;
  int iVar2;
  char in_CL;
  undefined1 in_DL;
  RefreshFrameInfo *in_RSI;
  AV1_COMP *in_RDI;
  int in_R8D;
  GF_GROUP *gf_group;
  ExtRefreshFrameFlagsInfo *ext_refresh_frame_flags;
  
  (in_RDI->rc).is_src_frame_alt_ref = 0;
  switch(in_DL) {
  case 0:
    set_refresh_frame_flags(in_RSI,true,true,true);
    break;
  case 1:
    set_refresh_frame_flags(in_RSI,false,false,false);
    break;
  case 2:
    set_refresh_frame_flags(in_RSI,true,false,false);
    break;
  case 3:
    if (in_CL == '\0') {
      set_refresh_frame_flags(in_RSI,true,true,true);
    }
    else {
      set_refresh_frame_flags(in_RSI,false,false,true);
    }
    break;
  case 4:
    if (in_CL == '\0') {
      set_refresh_frame_flags(in_RSI,true,true,true);
    }
    else {
      set_refresh_frame_flags(in_RSI,true,false,false);
    }
    (in_RDI->rc).is_src_frame_alt_ref = 1;
    break;
  case 5:
    set_refresh_frame_flags(in_RSI,false,false,false);
    (in_RDI->rc).is_src_frame_alt_ref = 1;
    break;
  case 6:
    set_refresh_frame_flags(in_RSI,false,true,false);
  }
  if ((((in_RDI->ext_flags).refresh_frame.update_pending & 1U) != 0) &&
     (iVar2 = is_stat_generation_stage(in_RDI), iVar2 == 0)) {
    set_refresh_frame_flags
              (in_RSI,(_Bool)((in_RDI->ext_flags).refresh_frame.golden_frame & 1),
               (_Bool)((in_RDI->ext_flags).refresh_frame.bwd_ref_frame & 1),
               (_Bool)((in_RDI->ext_flags).refresh_frame.alt_ref_frame & 1));
    pAVar1 = in_RDI->ppi;
    if (((in_RDI->ext_flags).refresh_frame.golden_frame & 1U) != 0) {
      (pAVar1->gf_group).update_type[in_RDI->gf_frame_index] = '\x02';
    }
    if (((in_RDI->ext_flags).refresh_frame.alt_ref_frame & 1U) != 0) {
      (pAVar1->gf_group).update_type[in_RDI->gf_frame_index] = '\x03';
    }
    if (((in_RDI->ext_flags).refresh_frame.bwd_ref_frame & 1U) != 0) {
      (pAVar1->gf_group).update_type[in_RDI->gf_frame_index] = '\x06';
    }
  }
  if (in_R8D != 0) {
    set_refresh_frame_flags(in_RSI,true,true,true);
  }
  return;
}

Assistant:

void av1_configure_buffer_updates(AV1_COMP *const cpi,
                                  RefreshFrameInfo *const refresh_frame,
                                  const FRAME_UPDATE_TYPE type,
                                  const REFBUF_STATE refbuf_state,
                                  int force_refresh_all) {
  // NOTE(weitinglin): Should we define another function to take care of
  // cpi->rc.is_$Source_Type to make this function as it is in the comment?
  const ExtRefreshFrameFlagsInfo *const ext_refresh_frame_flags =
      &cpi->ext_flags.refresh_frame;
  cpi->rc.is_src_frame_alt_ref = 0;

  switch (type) {
    case KF_UPDATE:
      set_refresh_frame_flags(refresh_frame, true, true, true);
      break;

    case LF_UPDATE:
      set_refresh_frame_flags(refresh_frame, false, false, false);
      break;

    case GF_UPDATE:
      set_refresh_frame_flags(refresh_frame, true, false, false);
      break;

    case OVERLAY_UPDATE:
      if (refbuf_state == REFBUF_RESET)
        set_refresh_frame_flags(refresh_frame, true, true, true);
      else
        set_refresh_frame_flags(refresh_frame, true, false, false);

      cpi->rc.is_src_frame_alt_ref = 1;
      break;

    case ARF_UPDATE:
      // NOTE: BWDREF does not get updated along with ALTREF_FRAME.
      if (refbuf_state == REFBUF_RESET)
        set_refresh_frame_flags(refresh_frame, true, true, true);
      else
        set_refresh_frame_flags(refresh_frame, false, false, true);

      break;

    case INTNL_OVERLAY_UPDATE:
      set_refresh_frame_flags(refresh_frame, false, false, false);
      cpi->rc.is_src_frame_alt_ref = 1;
      break;

    case INTNL_ARF_UPDATE:
      set_refresh_frame_flags(refresh_frame, false, true, false);
      break;

    default: assert(0); break;
  }

  if (ext_refresh_frame_flags->update_pending &&
      (!is_stat_generation_stage(cpi))) {
    set_refresh_frame_flags(refresh_frame,
                            ext_refresh_frame_flags->golden_frame,
                            ext_refresh_frame_flags->bwd_ref_frame,
                            ext_refresh_frame_flags->alt_ref_frame);
    GF_GROUP *gf_group = &cpi->ppi->gf_group;
    if (ext_refresh_frame_flags->golden_frame)
      gf_group->update_type[cpi->gf_frame_index] = GF_UPDATE;
    if (ext_refresh_frame_flags->alt_ref_frame)
      gf_group->update_type[cpi->gf_frame_index] = ARF_UPDATE;
    if (ext_refresh_frame_flags->bwd_ref_frame)
      gf_group->update_type[cpi->gf_frame_index] = INTNL_ARF_UPDATE;
  }

  if (force_refresh_all)
    set_refresh_frame_flags(refresh_frame, true, true, true);
}